

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NscParserRoutines.cpp
# Opt level: O0

CNscPStackEntry * NscBuildStatementFence(void)

{
  bool bVar1;
  NscSymbolFence *pNVar2;
  CNscPStackEntry *unaff_retaddr;
  NscSymbolFence *pFence;
  CNscPStackEntry *pOut;
  undefined4 in_stack_ffffffffffffffe8;
  NscType in_stack_ffffffffffffffec;
  CNscContext *in_stack_fffffffffffffff0;
  NscFenceType nFenceType;
  CNscPStackEntry *pSymbol;
  
  bVar1 = CNscContext::IsPhase2(g_pCtx);
  if ((bVar1) || (bVar1 = CNscContext::IsNWScript(g_pCtx), bVar1)) {
    pSymbol = CNscContext::GetPStackEntry
                        (in_stack_fffffffffffffff0,
                         (char *)CONCAT44(in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8),0);
    CNscPStackEntry::SetType((CNscPStackEntry *)in_stack_fffffffffffffff0,in_stack_ffffffffffffffec)
    ;
    pNVar2 = CNscContext::GetCurrentFence(g_pCtx);
    bVar1 = SUB81((ulong)pNVar2 >> 0x18,0);
    nFenceType = (NscFenceType)((ulong)pNVar2 >> 0x20);
    if (pNVar2 == (NscSymbolFence *)0x0) {
      NscPushFence(unaff_retaddr,(NscSymbol *)pSymbol,nFenceType,bVar1);
    }
    else if ((pNVar2->fEatScope & 1U) == 0) {
      NscPushFence(unaff_retaddr,(NscSymbol *)pSymbol,nFenceType,bVar1);
    }
    else {
      pNVar2->fEatScope = false;
    }
  }
  else {
    pSymbol = (CNscPStackEntry *)0x0;
  }
  return pSymbol;
}

Assistant:

YYSTYPE NscBuildStatementFence ()
{
	CNscPStackEntry *pOut;

	//
	// If this is phase1 and we are in a function, do nothing
	//

	if (!g_pCtx ->IsPhase2 () && !g_pCtx ->IsNWScript ())
	{
		pOut = NULL;
	}

	//
	// Otherwise, create a new fence
	//

	else
	{
		pOut = g_pCtx ->GetPStackEntry (__FILE__, __LINE__);
		pOut ->SetType (NscType_Unknown);

		//
		// A new fence isn't really created unless we are inside a function
		// and if the previous fence isn't marked to eat the next fence.
		// The eat fence is used for constructs such as IF that create their
		// own fence and need the '{}' to not create their's.
		//

		NscSymbolFence *pFence = g_pCtx ->GetCurrentFence ();
		if (pFence == NULL)
            NscPushFence (pOut, NULL, NscFenceType_Scope, false);
		else
		{
			if (pFence ->fEatScope)
				pFence ->fEatScope = false;
			else
	            NscPushFence (pOut, NULL, NscFenceType_Scope, false);
		}
	}
	return pOut;
}